

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
RepeatedPtrFieldPtrsIteratorTest_UninitializedConstPtrIterator_Test::TestBody
          (RepeatedPtrFieldPtrsIteratorTest_UninitializedConstPtrIterator_Test *this)

{
  RepeatedPtrFieldBase *pRVar1;
  
  pRVar1 = &((this->super_RepeatedPtrFieldPtrsIteratorTest).const_proto_array_)->
            super_RepeatedPtrFieldBase;
  if (((ulong)pRVar1->tagged_rep_or_elem_ & 1) != 0) {
    protobuf::internal::RepeatedPtrFieldBase::rep(pRVar1);
    pRVar1 = &((this->super_RepeatedPtrFieldPtrsIteratorTest).const_proto_array_)->
              super_RepeatedPtrFieldBase;
    if (((ulong)pRVar1->tagged_rep_or_elem_ & 1) != 0) {
      protobuf::internal::RepeatedPtrFieldBase::rep(pRVar1);
      pRVar1 = &((this->super_RepeatedPtrFieldPtrsIteratorTest).const_proto_array_)->
                super_RepeatedPtrFieldBase;
      if (((ulong)pRVar1->tagged_rep_or_elem_ & 1) != 0) {
        protobuf::internal::RepeatedPtrFieldBase::rep(pRVar1);
        pRVar1 = &((this->super_RepeatedPtrFieldPtrsIteratorTest).const_proto_array_)->
                  super_RepeatedPtrFieldBase;
        if (((ulong)pRVar1->tagged_rep_or_elem_ & 1) != 0) {
          protobuf::internal::RepeatedPtrFieldBase::rep(pRVar1);
          pRVar1 = &((this->super_RepeatedPtrFieldPtrsIteratorTest).const_proto_array_)->
                    super_RepeatedPtrFieldBase;
          if (((ulong)pRVar1->tagged_rep_or_elem_ & 1) != 0) {
            protobuf::internal::RepeatedPtrFieldBase::rep(pRVar1);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldPtrsIteratorTest, UninitializedConstPtrIterator) {
  RepeatedPtrField<std::string>::const_pointer_iterator iter;
  EXPECT_TRUE(iter != const_proto_array_->pointer_begin());
  EXPECT_TRUE(iter != const_proto_array_->pointer_begin() + 1);
  EXPECT_TRUE(iter != const_proto_array_->pointer_begin() + 2);
  EXPECT_TRUE(iter != const_proto_array_->pointer_begin() + 3);
  EXPECT_TRUE(iter != const_proto_array_->pointer_end());
}